

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_gej_rescale(secp256k1_gej *r,secp256k1_fe *s)

{
  secp256k1_fe *r_00;
  long lVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  secp256k1_scalar sVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  secp256k1_scalar *b;
  secp256k1_gej *r_01;
  ulong uVar12;
  secp256k1_ge *r_02;
  uint uVar13;
  ulong uVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  secp256k1_fe zz;
  int iStack_1b8;
  undefined1 auStack_180 [16];
  undefined1 auStack_170 [16];
  undefined1 auStack_160 [16];
  undefined1 auStack_150 [16];
  secp256k1_fe *psStack_138;
  ulong uStack_130;
  secp256k1_scalar sStack_124;
  secp256k1_fe sStack_120;
  undefined1 auStack_f0 [32];
  undefined1 auStack_d0 [16];
  secp256k1_fe sStack_c0;
  secp256k1_gej *psStack_88;
  undefined8 uStack_80;
  secp256k1_fe local_50;
  
  secp256k1_gej_verify(r);
  secp256k1_fe_verify(s);
  secp256k1_fe_verify(s);
  uVar7 = (s->n[4] >> 0x30) * 0x1000003d1 + s->n[0];
  if (((uVar7 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar7 & 0xfffffffffffff) == 0)) {
    uVar11 = (uVar7 >> 0x34) + s->n[1];
    r_01 = (secp256k1_gej *)((uVar11 >> 0x34) + s->n[2]);
    uVar12 = ((ulong)r_01 >> 0x34) + s->n[3];
    uVar14 = (uVar12 >> 0x34) + (s->n[4] & 0xffffffffffff);
    if ((((uVar11 | uVar7 | (ulong)r_01 | uVar12) & 0xfffffffffffff) == 0 && uVar14 == 0) ||
       (((uVar7 | 0x1000003d0) & uVar11 & (ulong)r_01 & uVar12 & (uVar14 ^ 0xf000000000000)) ==
        0xfffffffffffff)) {
      secp256k1_gej_rescale_cold_1();
      uStack_80 = 0x1000003d0;
      auStack_180 = (undefined1  [16])0x0;
      auStack_170 = (undefined1  [16])0x0;
      auStack_160 = (undefined1  [16])0x0;
      auStack_150 = (undefined1  [16])0x0;
      psStack_88 = r;
      secp256k1_scalar_add(&sStack_124,(secp256k1_scalar *)(uVar12 + 4),b);
      secp256k1_scalar_verify(&sStack_124);
      sVar5 = sStack_124;
      sStack_124 = 0;
      auStack_f0._8_8_ = &sStack_124;
      auStack_f0._0_8_ = 0x4d430001;
      auStack_f0._16_16_ = ZEXT816(4);
      auStack_d0 = ZEXT816(0);
      uVar7 = (long)auStack_f0 * 8;
      uVar11 = uVar7 >> 0x33;
      uVar7 = ((uVar7 | (ulong)auStack_f0 >> 0x3d) << 0xd | uVar11) >> 3;
      r_02 = (secp256k1_ge *)(uVar7 << 0x33 | (uVar11 << 0x3d | uVar7) >> 0xd);
      psStack_138 = (secp256k1_fe *)(uVar12 + 0x70);
      bVar4 = true;
      iStack_1b8 = 1;
      uStack_130 = uVar12;
      while( true ) {
        iVar6 = 0;
        uVar9 = 0;
        iVar10 = iStack_1b8;
        do {
          bVar3 = (byte)iVar10 & 0x1f;
          bVar2 = (byte)iVar6 & 0x1f;
          uVar9 = (sVar5 >> bVar3 | sVar5 << 0x20 - bVar3) << ((byte)iVar6 & 0x1f) ^
                  uVar9 & (-2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2);
          iVar10 = iVar10 + 2;
          iVar6 = iVar6 + 1;
        } while (iVar6 == 1);
        uVar7 = 0;
        do {
          uVar13 = (uint)(((uVar9 ^ uVar9 >> 1) & 1) << 6 == uVar7);
          uVar12 = (ulong)((long)r_02 << 3) >> 0x33;
          uVar14 = (((long)r_02 << 3 | (ulong)r_02 >> 0x3d) << 0xd | uVar12) >> 3;
          uVar11 = uVar14 << 0x33;
          lVar1 = (long)(int)uVar13 + -1;
          lVar8 = -(long)(int)uVar13;
          auVar16._8_4_ = (int)lVar1;
          auVar16._0_8_ = lVar1;
          auVar16._12_4_ = (int)((ulong)lVar1 >> 0x20);
          auVar18._8_4_ = (int)lVar8;
          auVar18._0_8_ = lVar8;
          auVar18._12_4_ = (int)((ulong)lVar8 >> 0x20);
          auStack_180 = *(undefined1 (*) [16])
                         ((long)secp256k1_ecmult_gen_prec_table[0][0].x.n + uVar7) & auVar18 |
                        auStack_180 & auVar16;
          auStack_170 = auVar18 & *(undefined1 (*) [16])
                                   ((long)secp256k1_ecmult_gen_prec_table[0][0].x.n + uVar7 + 0x10)
                        | auVar16 & auStack_170;
          uVar12 = (uVar11 | (uVar12 << 0x3d | uVar14) >> 0xd) << 3;
          uVar14 = uVar12 >> 0x33;
          uVar11 = ((uVar12 | uVar11 >> 0x3d) << 0xd | uVar14) >> 3;
          r_02 = (secp256k1_ge *)(uVar11 << 0x33 | (uVar14 << 0x3d | uVar11) >> 0xd);
          lVar1 = (long)(int)uVar13 + -1;
          lVar8 = -(long)(int)uVar13;
          auVar17._8_4_ = (int)lVar1;
          auVar17._0_8_ = lVar1;
          auVar17._12_4_ = (int)((ulong)lVar1 >> 0x20);
          auVar19._8_4_ = (int)lVar8;
          auVar19._0_8_ = lVar8;
          auVar19._12_4_ = (int)((ulong)lVar8 >> 0x20);
          auStack_160 = *(undefined1 (*) [16])
                         ((long)secp256k1_ecmult_gen_prec_table[0][0].y.n + uVar7) & auVar19 |
                        auStack_160 & auVar17;
          auStack_150 = auVar19 & *(undefined1 (*) [16])
                                   ((long)secp256k1_ecmult_gen_prec_table[0][0].y.n + uVar7 + 0x10)
                        | auVar17 & auStack_150;
          uVar7 = uVar7 + 0x40;
        } while (uVar7 == 0x40);
        secp256k1_ge_from_storage(r_02,(secp256k1_ge_storage *)auStack_180);
        secp256k1_fe_verify(&sStack_c0);
        secp256k1_fe_verify_magnitude(&sStack_c0,1);
        sStack_120.n[1] = 0x3ffffffffffffc - sStack_c0.n[1];
        sStack_120.n[0] = 0x3ffffbfffff0bc - sStack_c0.n[0];
        sStack_120.n[3] = 0x3ffffffffffffc - sStack_c0.n[3];
        sStack_120.n[2] = 0x3ffffffffffffc - sStack_c0.n[2];
        sStack_120._40_8_ = 2;
        sStack_120.n[4] = 0x3fffffffffffc - sStack_c0.n[4];
        secp256k1_fe_verify(&sStack_120);
        secp256k1_fe_cmov(&sStack_c0,&sStack_120,uVar9 >> 1 & 1);
        if (bVar4) {
          secp256k1_gej_set_ge(r_01,(secp256k1_ge *)auStack_f0);
          secp256k1_gej_rescale(r_01,psStack_138);
          bVar4 = false;
        }
        else {
          secp256k1_gej_add_ge(r_01,r_01,(secp256k1_ge *)auStack_f0);
        }
        bVar15 = iStack_1b8 == 0;
        iStack_1b8 = iStack_1b8 + -1;
        if (bVar15) break;
        secp256k1_gej_double(r_01,r_01);
        r_02 = (secp256k1_ge *)auStack_f0;
      }
      secp256k1_gej_add_ge(r_01,r_01,(secp256k1_ge *)(uStack_130 + 8));
      return;
    }
  }
  secp256k1_fe_sqr(&local_50,s);
  secp256k1_fe_mul(&r->x,&r->x,&local_50);
  r_00 = &r->y;
  secp256k1_fe_mul(r_00,r_00,&local_50);
  secp256k1_fe_mul(r_00,r_00,s);
  secp256k1_fe_mul(&r->z,&r->z,s);
  secp256k1_gej_verify(r);
  return;
}

Assistant:

static void secp256k1_gej_rescale(secp256k1_gej *r, const secp256k1_fe *s) {
    /* Operations: 4 mul, 1 sqr */
    secp256k1_fe zz;
    SECP256K1_GEJ_VERIFY(r);
    SECP256K1_FE_VERIFY(s);
    VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero_var(s));

    secp256k1_fe_sqr(&zz, s);
    secp256k1_fe_mul(&r->x, &r->x, &zz);                /* r->x *= s^2 */
    secp256k1_fe_mul(&r->y, &r->y, &zz);
    secp256k1_fe_mul(&r->y, &r->y, s);                  /* r->y *= s^3 */
    secp256k1_fe_mul(&r->z, &r->z, s);                  /* r->z *= s   */

    SECP256K1_GEJ_VERIFY(r);
}